

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::presolve(Highs *this)

{
  HighsModel *this_00;
  int iVar1;
  HessianFormat HVar2;
  bool bVar3;
  int iVar4;
  HighsStatus HVar5;
  long *plVar6;
  Highs *in_RSI;
  uint numThreads;
  string local_48;
  
  bVar3 = HighsLp::needsMods(&(this->model_).lp_,
                             (this->options_).super_HighsOptionsStruct.infinite_cost);
  if (bVar3) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Model contains infinite costs or semi-variables, so cannot be presolved independently\n"
                );
    return kError;
  }
  reportModelStats(this);
  this->model_presolve_status_ = kNotPresolved;
  this_00 = &this->presolved_model_;
  HighsModel::clear(this_00);
  PresolveComponent::clear(&this->presolve_);
  HVar5 = kOk;
  if ((this->model_).lp_.num_row_ != 0 || (this->model_).lp_.num_col_ != 0) {
    numThreads = (this->options_).super_HighsOptionsStruct.threads;
    if (numThreads == 0) {
      iVar4 = std::thread::hardware_concurrency();
      numThreads = iVar4 + 1U >> 1;
    }
    HighsTaskExecutor::initialize(numThreads);
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    plVar6 = (long *)__tls_get_addr(&PTR_00449ef0);
    iVar4 = *(int *)(*plVar6 + 0x28);
    this->max_threads = iVar4;
    iVar1 = (this->options_).super_HighsOptionsStruct.threads;
    if (iVar4 != iVar1 && iVar1 != 0) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                   "Option \'threads\' is set to %d but global scheduler has already been initialized to use %d threads. The previous scheduler instance can be destroyed by calling Highs::resetGlobalScheduler().\n"
                  );
      return kError;
    }
    in_RSI = (Highs *)0x0;
    HVar5 = runPresolve(this,false,true);
  }
  this->model_presolve_status_ = HVar5;
  switch(HVar5) {
  case kOk:
    HighsLp::operator=(&this_00->lp_,&(this->model_).lp_);
    HVar2 = (this->model_).hessian_.format_;
    (this->presolved_model_).hessian_.dim_ = (this->model_).hessian_.dim_;
    (this->presolved_model_).hessian_.format_ = HVar2;
    std::vector<int,_std::allocator<int>_>::operator=
              (&(this->presolved_model_).hessian_.start_,&(this->model_).hessian_.start_);
    std::vector<int,_std::allocator<int>_>::operator=
              (&(this->presolved_model_).hessian_.index_,&(this->model_).hessian_.index_);
    in_RSI = (Highs *)&(this->model_).hessian_.value_;
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->presolved_model_).hessian_.value_,
               (vector<double,_std::allocator<double>_> *)in_RSI);
    break;
  case kWarning:
    in_RSI = (Highs *)0x8;
    setHighsModelStatusAndClearSolutionAndBasis(this,kInfeasible);
    break;
  case 2:
    break;
  case 3:
  case 4:
    HVar5 = kOk;
    goto LAB_0020b7b1;
  case 5:
    HVar5 = kWarning;
LAB_0020b7b1:
    bVar3 = true;
    goto LAB_0020b7b4;
  case kError:
    bVar3 = false;
    goto LAB_0020b7b4;
  default:
    bVar3 = false;
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Presolve fails due to memory allocation error\n");
    in_RSI = (Highs *)0x3;
    setHighsModelStatusAndClearSolutionAndBasis(this,kPresolveError);
    HVar5 = kError;
    goto LAB_0020b7b4;
  }
  bVar3 = false;
  HVar5 = kOk;
LAB_0020b7b4:
  if (bVar3) {
    in_RSI = (Highs *)&(this->presolve_).data_.reduced_lp_;
    HighsLp::operator=(&this_00->lp_,(HighsLp *)in_RSI);
    HighsLp::setMatrixDimensions(&this_00->lp_);
  }
  presolveStatusToString_abi_cxx11_(&local_48,in_RSI,this->model_presolve_status_);
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,"Presolve status: %s\n",
               local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  HVar5 = returnFromHighs(this,HVar5);
  return HVar5;
}

Assistant:

HighsStatus Highs::presolve() {
  if (model_.needsMods(options_.infinite_cost)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model contains infinite costs or semi-variables, so cannot "
                 "be presolved independently\n");
    return HighsStatus::kError;
  }
  HighsStatus return_status = HighsStatus::kOk;

  this->reportModelStats();
  clearPresolve();
  if (model_.isEmpty()) {
    model_presolve_status_ = HighsPresolveStatus::kNotReduced;
  } else {
    const bool force_presolve = true;
    // make sure global scheduler is initialized before calling presolve, since
    // MIP presolve may use parallelism
    highs::parallel::initialize_scheduler(options_.threads);
    max_threads = highs::parallel::num_threads();
    if (options_.threads != 0 && max_threads != options_.threads) {
      highsLogUser(
          options_.log_options, HighsLogType::kError,
          "Option 'threads' is set to %d but global scheduler has already been "
          "initialized to use %d threads. The previous scheduler instance can "
          "be destroyed by calling Highs::resetGlobalScheduler().\n",
          (int)options_.threads, max_threads);
      return HighsStatus::kError;
    }
    const bool force_lp_presolve = false;
    model_presolve_status_ = runPresolve(force_lp_presolve, force_presolve);
  }

  bool using_reduced_lp = false;
  switch (model_presolve_status_) {
    case HighsPresolveStatus::kNotPresolved: {
      // Shouldn't happen
      assert(model_presolve_status_ != HighsPresolveStatus::kNotPresolved);
      return_status = HighsStatus::kError;
      break;
    }
    case HighsPresolveStatus::kNotReduced:
    case HighsPresolveStatus::kInfeasible:
    case HighsPresolveStatus::kReduced:
    case HighsPresolveStatus::kReducedToEmpty:
    case HighsPresolveStatus::kUnboundedOrInfeasible: {
      // All OK
      if (model_presolve_status_ == HighsPresolveStatus::kInfeasible) {
        // Infeasible model, so indicate that the incumbent model is
        // known as such
        setHighsModelStatusAndClearSolutionAndBasis(
            HighsModelStatus::kInfeasible);
      } else if (model_presolve_status_ == HighsPresolveStatus::kNotReduced) {
        // No reduction, so fill Highs presolved model with the
        // incumbent model
        presolved_model_ = model_;
      } else if (model_presolve_status_ == HighsPresolveStatus::kReduced ||
                 model_presolve_status_ ==
                     HighsPresolveStatus::kReducedToEmpty) {
        // Nontrivial reduction, so fill Highs presolved model with the
        // presolved model
        using_reduced_lp = true;
      }
      return_status = HighsStatus::kOk;
      break;
    }
    case HighsPresolveStatus::kTimeout: {
      // Timeout, so assume that it's OK to fill the Highs presolved model with
      // the presolved model, but return warning.
      using_reduced_lp = true;
      return_status = HighsStatus::kWarning;
      break;
    }
    default: {
      // case HighsPresolveStatus::kOutOfMemory
      assert(model_presolve_status_ == HighsPresolveStatus::kOutOfMemory);
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Presolve fails due to memory allocation error\n");
      setHighsModelStatusAndClearSolutionAndBasis(
          HighsModelStatus::kPresolveError);
      return_status = HighsStatus::kError;
    }
  }
  if (using_reduced_lp) {
    presolved_model_.lp_ = presolve_.getReducedProblem();
    presolved_model_.lp_.setMatrixDimensions();
  }

  highsLogUser(options_.log_options, HighsLogType::kInfo,
               "Presolve status: %s\n",
               presolveStatusToString(model_presolve_status_).c_str());
  return returnFromHighs(return_status);
}